

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPluginInternal.hpp
# Opt level: O1

void __thiscall
DISTRHO::PluginExporter::run(PluginExporter *this,float **inputs,float **outputs,uint32_t frames)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (this->fData == (PrivateData *)0x0) {
    pcVar2 = "fData != nullptr";
    uVar1 = 0x354;
  }
  else {
    if (this->fPlugin != (Plugin *)0x0) {
      if (this->fIsActive == false) {
        this->fIsActive = true;
        (*this->fPlugin->_vptr_Plugin[0xf])();
      }
      this->fData->isProcessing = true;
      (*this->fPlugin->_vptr_Plugin[0x11])(this->fPlugin,inputs,outputs,(ulong)frames);
      this->fData->isProcessing = false;
      return;
    }
    pcVar2 = "fPlugin != nullptr";
    uVar1 = 0x355;
  }
  d_stderr2("assertion failure: \"%s\" in file %s, line %i",pcVar2,
            "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]fverb/dpf/distrho/src/DistrhoPluginInternal.hpp"
            ,uVar1);
  return;
}

Assistant:

void run(const float** const inputs, float** const outputs, const uint32_t frames)
    {
        DISTRHO_SAFE_ASSERT_RETURN(fData != nullptr,);
        DISTRHO_SAFE_ASSERT_RETURN(fPlugin != nullptr,);

        if (! fIsActive)
        {
            fIsActive = true;
            fPlugin->activate();
        }

        fData->isProcessing = true;
        fPlugin->run(inputs, outputs, frames);
        fData->isProcessing = false;
    }